

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_get_default_i2c_bus(uint8_t platform_offset)

{
  mraa_boolean_t mVar1;
  uint local_c;
  uint8_t platform_offset_local;
  
  if (plat == (mraa_board_t *)0x0) {
    local_c = 0xffffffff;
  }
  else if (platform_offset == '\0') {
    local_c = plat->def_i2c_bus;
  }
  else {
    mVar1 = mraa_has_sub_platform();
    if (mVar1 == 0) {
      local_c = 0xffffffff;
    }
    else {
      local_c = plat->sub_platform->def_i2c_bus;
    }
  }
  return local_c;
}

Assistant:

int
mraa_get_default_i2c_bus(uint8_t platform_offset)
{
    if (plat == NULL)
        return -1;
    if (platform_offset == MRAA_MAIN_PLATFORM_OFFSET) {
        return plat->def_i2c_bus;
    } else {
        if (mraa_has_sub_platform())
            return plat->sub_platform->def_i2c_bus;
        else
            return -1;
    }
}